

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O1

bool __thiscall lzham::vector<unsigned_char>::append(vector<unsigned_char> *this,uchar *p,uint n)

{
  uint uVar1;
  bool bVar2;
  uint min_new_capacity;
  bool bVar3;
  
  if (n == 0) {
    return true;
  }
  uVar1 = this->m_size;
  min_new_capacity = uVar1 + n;
  if (!CARRY4(uVar1,n)) {
    if (this->m_capacity < min_new_capacity) {
      bVar3 = false;
      bVar2 = elemental_vector::increase_capacity
                        ((elemental_vector *)this,min_new_capacity,true,1,(object_mover)0x0,true);
      if (!bVar2) goto LAB_0010cb72;
    }
    memset(this->m_p + this->m_size,0,(ulong)(min_new_capacity - this->m_size));
  }
  this->m_size = min_new_capacity;
  bVar3 = true;
LAB_0010cb72:
  if (bVar3 != false) {
    memcpy(this->m_p + uVar1,p,(ulong)n);
  }
  return bVar3;
}

Assistant:

bool append(const T* p, uint n)
      {
         if (n)
            return insert(m_size, p, n);
         return true;
      }